

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  long lVar5;
  void *src_00;
  bool bVar6;
  ZSTD_frameSizeInfo ZVar7;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_64;
  ZSTD_frameHeader local_58;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar1 = ZSTD_getFrameHeader_advanced(&local_58,src,srcSize,ZSTD_f_zstd1);
    uVar4 = 0xfffffffffffffffe;
    if (sVar1 < 0xffffffffffffff89) {
      if (sVar1 == 0) {
        src_00 = (void *)((long)src + (ulong)local_58.headerSize);
        uVar3 = srcSize - local_58.headerSize;
        sVar1 = ZSTD_getcBlockSize(src_00,uVar3,&local_64);
        if (sVar1 < 0xffffffffffffff89) {
          lVar5 = 1;
          do {
            uVar2 = sVar1 + 3;
            bVar6 = uVar3 < uVar2;
            uVar3 = uVar3 - uVar2;
            if (bVar6) goto LAB_0022ee1c;
            src_00 = (void *)((long)src_00 + uVar2);
            if (local_64.lastBlock != 0) {
              if (local_58.checksumFlag != 0) {
                sVar1 = 0xffffffffffffffb8;
                if (uVar3 < 4) break;
                src_00 = (void *)((long)src_00 + 4);
              }
              sVar1 = (long)src_00 - (long)src;
              uVar4 = lVar5 * (ulong)local_58.blockSizeMax;
              if (local_58.frameContentSize != 0xffffffffffffffff) {
                uVar4 = local_58.frameContentSize;
              }
              break;
            }
            sVar1 = ZSTD_getcBlockSize(src_00,uVar3,&local_64);
            lVar5 = lVar5 + 1;
          } while (sVar1 < 0xffffffffffffff89);
        }
      }
      else {
LAB_0022ee1c:
        sVar1 = 0xffffffffffffffb8;
      }
    }
  }
  else if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
    uVar3 = (ulong)*(uint *)((long)src + 4) + 8;
    sVar1 = 0xffffffffffffffb8;
    if (uVar3 <= srcSize) {
      sVar1 = uVar3;
    }
    uVar4 = 0;
  }
  else {
    sVar1 = 0xfffffffffffffff2;
    uVar4 = 0;
  }
  ZVar7.decompressedBound = uVar4;
  ZVar7.compressedSize = sVar1;
  return ZVar7;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}